

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket.c
# Opt level: O1

int8_t msocket_startIoThread(msocket_t *self)

{
  int8_t iVar1;
  int iVar2;
  int *piVar3;
  
  if ((self->handlerTable == (msocket_handler_t *)0x0) || (self->threadRunning != '\0')) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    iVar1 = -1;
  }
  else {
    iVar2 = pthread_create(&self->ioThread,(pthread_attr_t *)0x0,ioTask,self);
    iVar1 = -1;
    if (iVar2 == 0) {
      self->threadRunning = '\x01';
      iVar1 = '\0';
    }
  }
  return iVar1;
}

Assistant:

static int8_t msocket_startIoThread(msocket_t *self){
   if( (self != 0) && (self->handlerTable != 0) && (self->threadRunning == 0) ){
#ifdef _WIN32
      THREAD_CREATE(self->ioThread,ioTask,self,self->ioThreadId);
      if(self->ioThread == INVALID_HANDLE_VALUE){
         return -1;
      }
#else
      int rc = THREAD_CREATE(self->ioThread,ioTask,self);
      if(rc != 0){
         return -1;
      }
#endif
      self->threadRunning = 1;
      return 0;
   }
   errno = EINVAL;
   return -1;
}